

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computation.c
# Opt level: O0

apx_error_t
apx_rationalScaling_create
          (apx_rationalScaling_t *self,double offset,int32_t numerator,int32_t denominator,
          char *unit)

{
  char *pcVar1;
  undefined1 local_40 [8];
  apx_computation_vtable_t vtable;
  char *unit_local;
  int32_t denominator_local;
  int32_t numerator_local;
  double offset_local;
  apx_rationalScaling_t *self_local;
  
  if (self == (apx_rationalScaling_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    vtable.to_string = (apx_to_string_func_t *)unit;
    apx_computation_vtable_create
              ((apx_computation_vtable_t *)local_40,apx_rationalScaling_vdestroy,
               apx_rationalScaling_vto_string);
    apx_computation_create(&self->base,(apx_computation_vtable_t *)local_40,'\x01');
    self->offset = offset;
    self->numerator = numerator;
    self->denominator = denominator;
    if (vtable.to_string == (apx_to_string_func_t *)0x0) {
      self->unit = (char *)0x0;
    }
    else {
      pcVar1 = strdup((char *)vtable.to_string);
      self->unit = pcVar1;
      if (vtable.to_string == (apx_to_string_func_t *)0x0) {
        return 2;
      }
    }
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_rationalScaling_create(apx_rationalScaling_t* self, double offset, int32_t numerator, int32_t denominator, char const* unit)
{
   if (self != NULL)
   {
      apx_computation_vtable_t vtable;
      apx_computation_vtable_create(&vtable, apx_rationalScaling_vdestroy, apx_rationalScaling_vto_string);
      apx_computation_create(&self->base, &vtable, APX_COMPUTATION_TYPE_RATIONAL_SCALING);
      self->offset = offset;
      self->numerator = numerator;
      self->denominator = denominator;
      if (unit != NULL)
      {
         self->unit = STRDUP(unit);
         if (unit == NULL)
         {
            return APX_MEM_ERROR;
         }
      }
      else
      {
         self->unit = NULL;
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}